

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O2

Extra_SymmInfo_t * Extra_SymmPairsAllocate(int nVars)

{
  Extra_SymmInfo_t *pEVar1;
  int *piVar2;
  char **ppcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  pEVar1 = (Extra_SymmInfo_t *)calloc(1,0x20);
  pEVar1->nVars = nVars;
  lVar6 = (long)nVars;
  piVar2 = (int *)malloc(lVar6 * 4);
  pEVar1->pVars = piVar2;
  ppcVar3 = (char **)malloc(lVar6 * 8);
  pEVar1->pSymms = ppcVar3;
  pcVar4 = (char *)calloc(1,(ulong)(uint)(nVars * nVars));
  *ppcVar3 = pcVar4;
  for (lVar5 = 1; lVar5 < lVar6; lVar5 = lVar5 + 1) {
    ppcVar3[lVar5] = ppcVar3[lVar5 + -1] + lVar6;
  }
  return pEVar1;
}

Assistant:

Extra_SymmInfo_t * Extra_SymmPairsAllocate( int nVars )
{
    int i;
    Extra_SymmInfo_t * p;

    // allocate and clean the storage for symmetry info
    p = ABC_ALLOC( Extra_SymmInfo_t, 1 );
    memset( p, 0, sizeof(Extra_SymmInfo_t) );
    p->nVars     = nVars;
    p->pVars     = ABC_ALLOC( int, nVars );  
    p->pSymms    = ABC_ALLOC( char *, nVars );  
    p->pSymms[0] = ABC_ALLOC( char  , nVars * nVars );
    memset( p->pSymms[0], 0, nVars * nVars * sizeof(char) );

    for ( i = 1; i < nVars; i++ )
        p->pSymms[i] = p->pSymms[i-1] + nVars;

    return p;
}